

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day19.cpp
# Opt level: O1

void day19(input_t input)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t mult;
  int iVar7;
  char *pcVar8;
  array<unsigned_int,_2UL> *__range1;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint32_t fk;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  array<unsigned_int,_2UL> part;
  Quad tmp;
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> V;
  uint32_t R [8];
  ulong local_98;
  array<signed_char,_4UL> local_8c;
  void *local_88;
  iterator iStack_80;
  array<signed_char,_4UL> *local_78;
  ulong local_68 [5];
  uint local_3c [3];
  
  pcVar8 = input.s;
  pcVar1 = pcVar8 + input.len;
  lVar10 = input.len;
  do {
    lVar11 = lVar10;
    lVar10 = lVar11 + -1;
    if (lVar11 == 0) {
      lVar10 = -1;
      pcVar8 = pcVar1;
      bVar3 = 0xff;
      break;
    }
    cVar4 = *pcVar8;
    pcVar8 = pcVar8 + 1;
    bVar3 = cVar4 - 0x30;
  } while (5 < bVar3);
  if (bVar3 == 0xff) {
LAB_001108be:
    abort();
  }
  local_88 = (void *)0x0;
  iStack_80._M_current = (array<signed_char,_4UL> *)0x0;
  local_78 = (array<signed_char,_4UL> *)0x0;
  if (lVar10 != 0) {
    bVar2 = false;
    lVar10 = 1;
    cVar4 = '\0';
    iVar7 = 0;
    do {
      if ((byte)(pcVar8[lVar10 + -1] - 0x30U) < 100) {
        cVar4 = (pcVar8[lVar10 + -1] - 0x30U) + cVar4 * '\n';
        bVar2 = true;
      }
      else {
        if (bVar2) {
          local_8c._M_elems[iVar7] = cVar4;
          iVar7 = iVar7 + 1;
          if (iVar7 == 4) {
            if (iStack_80._M_current == local_78) {
              std::vector<std::array<signed_char,4ul>,std::allocator<std::array<signed_char,4ul>>>::
              _M_realloc_insert<std::array<signed_char,4ul>const&>
                        ((vector<std::array<signed_char,4ul>,std::allocator<std::array<signed_char,4ul>>>
                          *)&local_88,iStack_80,&local_8c);
            }
            else {
              *&(iStack_80._M_current)->_M_elems = local_8c._M_elems;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            iVar7 = 0;
          }
          cVar4 = '\0';
        }
        bVar2 = false;
      }
      lVar10 = lVar10 + 1;
    } while (lVar11 != lVar10);
  }
  local_98 = 0x100000000;
  lVar10 = (long)(char)bVar3;
  lVar11 = 0;
  do {
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[0] = (ulong)*(uint *)((long)&local_98 + lVar11);
    uVar15 = *(uint *)((long)local_68 + lVar10 * 4);
    while (uVar5 = (ulong)uVar15, uVar5 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2))
    {
      uVar6 = (uint)*(char *)((long)local_88 + uVar5 * 4 + 1);
      uVar13 = (uint)*(char *)((long)local_88 + uVar5 * 4 + 2);
      uVar15 = *(uint *)((long)local_68 + (ulong)(uVar6 & 7) * 4);
      iVar7 = *(int *)((long)local_68 + (ulong)(uVar13 & 7) * 4);
      bVar3 = *(byte *)((long)local_88 + uVar5 * 4);
      if (bVar3 < 0xcd) {
        if (bVar3 < 0x4d) {
          if (bVar3 != 2) {
            if (bVar3 != 0x42) goto LAB_001108be;
            *(int *)((long)&local_98 + lVar11) = iVar7;
            break;
          }
          uVar6 = iVar7 + uVar15;
        }
        else if ((bVar3 != 0x4d) && (uVar6 = uVar15, bVar3 != 0x56)) goto LAB_001108be;
      }
      else if (bVar3 == 0xcd) {
        uVar6 = uVar15 * uVar13;
      }
      else if (bVar3 == 0xd6) {
        uVar6 = iVar7 * uVar15;
      }
      else {
        if (bVar3 != 0xf9) goto LAB_001108be;
        uVar6 = uVar15 + uVar13;
      }
      *(uint *)((long)local_68 + (ulong)(*(byte *)((long)local_88 + uVar5 * 4 + 3) & 7) * 4) = uVar6
      ;
      uVar15 = *(int *)((long)local_68 + lVar10 * 4) + 1;
      *(uint *)((long)local_68 + lVar10 * 4) = uVar15;
    }
    uVar5 = (ulong)*(uint *)((long)&local_98 + lVar11);
    local_3c[0] = 2;
    local_3c[1] = 3;
    local_3c[2] = 5;
    iVar7 = 1;
    lVar14 = 0;
    do {
      uVar15 = *(uint *)((long)local_3c + lVar14);
      if ((int)(uVar5 % (ulong)uVar15) == 0) {
        iVar16 = 1;
        iVar12 = 1;
        do {
          uVar5 = uVar5 / uVar15;
          iVar12 = iVar12 * uVar15;
          iVar16 = iVar16 + iVar12;
        } while ((int)(uVar5 % (ulong)uVar15) == 0);
        iVar7 = iVar7 * iVar16;
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0xc);
    if (0x30 < (uint)uVar5) {
      uVar9 = 7;
      uVar15 = 0x62642424;
      do {
        if ((int)(uVar5 % uVar9) == 0) {
          iVar16 = 1;
          iVar12 = 1;
          do {
            uVar5 = uVar5 / uVar9;
            iVar12 = iVar12 * (int)uVar9;
            iVar16 = iVar16 + iVar12;
          } while ((int)(uVar5 % uVar9) == 0);
          iVar7 = iVar7 * iVar16;
        }
        uVar6 = (int)uVar9 + (uVar15 & 0xf);
        uVar9 = (ulong)uVar6;
        uVar15 = uVar15 >> 4 | uVar15 << 0x1c;
      } while (uVar6 * uVar6 <= (uint)uVar5);
    }
    iVar12 = (uint)uVar5 + 1;
    if ((uint)uVar5 < 2) {
      iVar12 = 1;
    }
    *(int *)((long)&local_98 + lVar11) = iVar12 * iVar7;
    lVar11 = lVar11 + 4;
    if (lVar11 == 8) {
      printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n",local_98 & 0xffffffff,local_98 >> 0x20);
      if (local_88 != (void *)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      return;
    }
  } while( true );
}

Assistant:

void day19(input_t input) {
	int8_t ipreg = -1;

	while (input.len--) {
		uint8_t c = *input.s++ - '0';
		if (c < 6) {
			ipreg = c;
			break;
		}
	}
	if (ipreg == -1) {
		abort();
	}

	std::vector<Quad> V;
	Quad tmp;
	for (int have = 0, n = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 100) {
			have = 1;
			n = 10 * n + c;
		} else if (have) {
			tmp[i] = n;
			n = have = 0;
			if (++i == 4) {
				i = 0;
				V.push_back(tmp);
			}
		}
	}

	std::array<uint32_t, 2> part = { 0, 1 };
	for (auto&& P : part) {
		uint32_t R[8] = { P };
		for (auto &ip = R[ipreg]; ip < V.size(); ip++) {
			auto &O = V[ip];
			auto Ia = O[1],    Ib = O[2],     Ic = O[3];
			auto Ra = R[Ia&7], Rb = R[Ib&7], &Rc = R[Ic&7];
			switch (O[0]) {
			    case  -7: Rc = Ra + Ib;    break;     // addi
			    case   2: Rc = Ra + Rb;    break;     // addr
			    case  66: P  = Rb;         goto done; // eqrr
			    case -51: Rc = Ra * Ib;    break;     // muli
			    case -42: Rc = Ra * Rb;    break;     // mulr
			    case  77: Rc = Ia;         break;     // seti
			    case  86: Rc = Ra;         break;     // setr
			    default: abort();
			}
		}
done:
		P = divisor_sum(P);
	}

	printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n", part[0], part[1]);
}